

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O3

Expr * nivalis::anon_unknown_3::wrap_expr(Expr *__return_storage_ptr__,uint32_t opcode,Expr *a)

{
  pointer pAVar1;
  pointer __src;
  Expr *pEVar2;
  size_t __n;
  
  Expr::Expr(__return_storage_ptr__);
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::resize
            (&__return_storage_ptr__->ast,
             ((long)(a->ast).
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(a->ast).
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) + 1);
  pAVar1 = (__return_storage_ptr__->ast).
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
  *(uint32_t *)
   &(((AST *)&pAVar1->opcode)->
    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)._M_impl.
    super__Vector_impl_data._M_start = opcode;
  (pAVar1->field_1).ref = 0xffffffffffffffff;
  __src = (a->ast).
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
          _M_impl.super__Vector_impl_data._M_start;
  __n = (long)(a->ast).
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)__src;
  if (__n != 0) {
    pEVar2 = (Expr *)memmove((__return_storage_ptr__->ast).
                             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                             ._M_impl.super__Vector_impl_data._M_start + 1,__src,__n);
    return pEVar2;
  }
  return (Expr *)pAVar1;
}

Assistant:

Expr wrap_expr(uint32_t opcode, const Expr& a) {
    Expr new_expr;
    new_expr.ast.resize(a.ast.size() + 1);
    new_expr.ast[0] = opcode;
    std::copy(a.ast.begin(), a.ast.end(), new_expr.ast.begin() + 1);
    return new_expr;
}